

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O2

bool chaiscript::dispatch::detail::
     compare_types_cast<std::future<chaiscript::Boxed_Value>,std::function<chaiscript::Boxed_Value()>const&>
               (_func_future<chaiscript::Boxed_Value>_function<chaiscript::Boxed_Value_()>_ptr
                *param_1,Function_Params *params,Type_Conversions_State *t_conversions)

{
  Type_Conversions_State *in_RCX;
  function<chaiscript::Boxed_Value_()> local_20;
  
  boxed_cast<std::function<chaiscript::Boxed_Value()>const&>
            (&local_20,(chaiscript *)params->m_begin,(Boxed_Value *)t_conversions,in_RCX);
  std::_Function_base::~_Function_base(&local_20.super__Function_base);
  return true;
}

Assistant:

bool compare_types_cast(Ret (*)(Params...), const chaiscript::Function_Params &params, const Type_Conversions_State &t_conversions) noexcept {
        try {
          std::vector<Boxed_Value>::size_type i = 0;
          (boxed_cast<Params>(params[i++], &t_conversions), ...);
          return true;
        } catch (const exception::bad_boxed_cast &) {
          return false;
        }
      }